

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Compilation.cpp
# Opt level: O1

void __thiscall
slang::ast::Compilation::parseParamOverrides
          (Compilation *this,flat_hash_map<std::string_view,_const_ConstantValue_*> *results)

{
  undefined1 *puVar1;
  group_type_pointer pgVar2;
  size_t __n;
  void *__s;
  char *pcVar3;
  ScriptSession *pSVar4;
  uint uVar5;
  size_t __n_00;
  size_t *psVar6;
  int iVar7;
  void *pvVar8;
  NameSyntax *pNVar9;
  Diagnostic *this_00;
  uint64_t hash;
  ulong uVar10;
  uint uVar11;
  group_type_pointer pgVar12;
  ScriptSession *pSVar13;
  ScriptSession *pSVar14;
  ulong uVar15;
  ulong uVar16;
  size_t sVar17;
  long lVar18;
  ScriptSession *arg;
  bool bVar19;
  bool bVar20;
  undefined1 auVar21 [16];
  uchar uVar22;
  uchar uVar23;
  uchar uVar24;
  uchar uVar25;
  uchar uVar26;
  uchar uVar27;
  uchar uVar28;
  uchar uVar29;
  uchar uVar30;
  uchar uVar31;
  uchar uVar32;
  uchar uVar33;
  uchar uVar34;
  uchar uVar35;
  uchar uVar36;
  uchar uVar37;
  string_view name_00;
  string_view text;
  try_emplace_args_t local_1269;
  size_t *local_1268;
  string_view name;
  ConstantValue *local_1240;
  long local_1238;
  ulong local_1230;
  ScriptSession *local_1228;
  size_t local_1220;
  ulong local_1218;
  group_type_pointer local_1210;
  ScriptSession *local_1208;
  value_type *elements;
  TypedBumpAllocator<slang::ConstantValue> *local_11f8;
  ScriptSession *local_11f0;
  char *local_11e8;
  ScriptSession *local_11e0;
  uchar local_11d8;
  uchar uStack_11d7;
  uchar uStack_11d6;
  uchar uStack_11d5;
  uchar uStack_11d4;
  uchar uStack_11d3;
  uchar uStack_11d2;
  uchar uStack_11d1;
  uchar uStack_11d0;
  uchar uStack_11cf;
  uchar uStack_11ce;
  uchar uStack_11cd;
  uchar uStack_11cc;
  uchar uStack_11cb;
  uchar uStack_11ca;
  uchar uStack_11c9;
  ConstantValue cv;
  locator res;
  table_arrays<std::pair<const_std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::pow2_size_policy,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
  arrays;
  Diagnostics localDiags;
  ScriptSession session;
  
  if ((this->options).paramOverrides.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start !=
      (this->options).paramOverrides.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    pSVar14 = (ScriptSession *)&arrays;
    arrays.groups_size_mask = 1;
    arrays.groups_size_index = 0x3f;
    arrays._16_16_ = ZEXT816(0x47fac0);
    ScriptSession::ScriptSession(&session,(Bag *)pSVar14);
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                   *)&arrays);
    arg = (ScriptSession *)
          (this->options).paramOverrides.
          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start;
    local_11e0 = (ScriptSession *)
                 (this->options).paramOverrides.
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
    if (arg != local_11e0) {
      local_11f8 = &this->constantAllocator;
      do {
        __n = (arg->options).items.table_.
              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
              .arrays.groups_size_mask;
        if (__n == 0) {
          pSVar13 = (ScriptSession *)0xffffffffffffffff;
        }
        else {
          __s = (void *)(arg->options).items.table_.
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                        .arrays.groups_size_index;
          pvVar8 = memchr(__s,0x3d,__n);
          pSVar13 = (ScriptSession *)(-(ulong)(pvVar8 == (void *)0x0) | (long)pvVar8 - (long)__s);
        }
        if (pSVar13 == (ScriptSession *)0xffffffffffffffff) {
LAB_002957c9:
          this_00 = Scope::addDiag(&((this->root)._M_t.
                                     super___uniq_ptr_impl<slang::ast::RootSymbol,_std::default_delete<slang::ast::RootSymbol>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_slang::ast::RootSymbol_*,_std::default_delete<slang::ast::RootSymbol>_>
                                     .super__Head_base<0UL,_slang::ast::RootSymbol_*,_false>.
                                    _M_head_impl)->super_Scope,(DiagCode)0xf000d,
                                   (SourceLocation)0xffffffffffffffff);
          pSVar14 = arg;
          Diagnostic::operator<<(this_00,(string *)arg);
        }
        else {
          localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.data_ =
               (pointer)localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
                        super_SmallVectorBase<slang::Diagnostic>.firstElement;
          localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.len = 0;
          localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
          super_SmallVectorBase<slang::Diagnostic>.cap = 2;
          pcVar3 = (char *)(arg->options).items.table_.
                           super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                           .arrays.groups_size_index;
          pSVar4 = (ScriptSession *)
                   (arg->options).items.table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                   .arrays.groups_size_mask;
          pSVar14 = pSVar13;
          if (pSVar4 < pSVar13) {
            pSVar14 = pSVar4;
          }
          name_00._M_str = pcVar3;
          name_00._M_len = (size_t)pSVar14;
          name._M_len = (size_t)pSVar14;
          name._M_str = pcVar3;
          pNVar9 = tryParseName(this,name_00,&localDiags);
          bVar19 = true;
          if (((pNVar9->super_ExpressionSyntax).super_SyntaxNode.kind == IdentifierName) &&
             (localDiags.super_SmallVector<slang::Diagnostic,_2UL>.
              super_SmallVectorBase<slang::Diagnostic>.len == 0)) {
            puVar1 = (undefined1 *)
                     ((long)&(pSVar13->options).items.table_.
                             super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                             .arrays.groups_size_index + 1);
            if (pSVar4 <= pSVar13) {
              std::__throw_out_of_range_fmt
                        ("%s: __pos (which is %zu) > __size (which is %zu)",
                         "basic_string_view::substr",puVar1,pSVar4);
            }
            pSVar14 = &session;
            text._M_str = pcVar3 + (long)puVar1;
            text._M_len = (long)pSVar4 - (long)puVar1;
            ScriptSession::eval(&cv,pSVar14,text);
            bVar19 = cv.value.
                     super__Variant_base<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_assign_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Move_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Copy_ctor_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     .
                     super__Variant_storage_alias<std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue>,_std::__cxx11::basic_string<char>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                     ._M_index == '\0';
            if (!bVar19) {
              local_1240 = TypedBumpAllocator<slang::ConstantValue>::emplace<slang::ConstantValue>
                                     (local_11f8,&cv);
              hash = hash<std::basic_string_view<char,_std::char_traits<char>_>,_void>::operator()
                               ((hash<std::basic_string_view<char,_std::char_traits<char>_>,_void> *
                                )results,&name);
              __n_00 = name._M_len;
              pSVar13 = (ScriptSession *)
                        (hash >> ((byte)(results->table_).
                                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                                        .arrays.groups_size_index & 0x3f));
              pgVar12 = (results->table_).
                        super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                        .arrays.groups_;
              lVar18 = (hash & 0xff) * 4;
              uVar22 = (&UNK_0047fb5c)[lVar18];
              uVar23 = (&UNK_0047fb5d)[lVar18];
              uVar24 = (&UNK_0047fb5e)[lVar18];
              uVar25 = (&UNK_0047fb5f)[lVar18];
              elements = (results->table_).
                         super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                         .arrays.elements_;
              local_11e8 = name._M_str;
              uVar10 = (ulong)((uint)hash & 7);
              sVar17 = (results->table_).
                       super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                       .arrays.groups_size_mask;
              uVar16 = 0;
              uVar26 = uVar22;
              uVar27 = uVar23;
              uVar28 = uVar24;
              uVar29 = uVar25;
              uVar30 = uVar22;
              uVar31 = uVar23;
              uVar32 = uVar24;
              uVar33 = uVar25;
              uVar34 = uVar22;
              uVar35 = uVar23;
              uVar36 = uVar24;
              uVar37 = uVar25;
              local_1208 = pSVar13;
              do {
                pgVar2 = pgVar12 + (long)pSVar13;
                auVar21[0] = -(pgVar2->m[0].n == uVar22);
                auVar21[1] = -(pgVar2->m[1].n == uVar23);
                auVar21[2] = -(pgVar2->m[2].n == uVar24);
                auVar21[3] = -(pgVar2->m[3].n == uVar25);
                auVar21[4] = -(pgVar2->m[4].n == uVar26);
                auVar21[5] = -(pgVar2->m[5].n == uVar27);
                auVar21[6] = -(pgVar2->m[6].n == uVar28);
                auVar21[7] = -(pgVar2->m[7].n == uVar29);
                auVar21[8] = -(pgVar2->m[8].n == uVar30);
                auVar21[9] = -(pgVar2->m[9].n == uVar31);
                auVar21[10] = -(pgVar2->m[10].n == uVar32);
                auVar21[0xb] = -(pgVar2->m[0xb].n == uVar33);
                auVar21[0xc] = -(pgVar2->m[0xc].n == uVar34);
                auVar21[0xd] = -(pgVar2->m[0xd].n == uVar35);
                auVar21[0xe] = -(pgVar2->m[0xe].n == uVar36);
                auVar21[0xf] = -(pgVar2->m[0xf].n == uVar37);
                uVar11 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                        (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                        (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                        (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                        (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                        (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                        (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                        (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                        (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                        (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                        (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                        (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                        (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                        (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                                       (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
                uVar15 = uVar16;
                lVar18 = (long)pSVar13 * 0x10;
                if (uVar11 != 0) {
                  pSVar14 = (ScriptSession *)(elements + (long)pSVar13 * 0xf);
                  local_1238 = (long)pSVar13 * 0x10;
                  local_1230 = uVar16;
                  local_1228 = pSVar13;
                  local_1220 = sVar17;
                  local_1218 = uVar10;
                  local_1210 = pgVar12;
                  local_11f0 = pSVar14;
                  local_11d8 = uVar22;
                  uStack_11d7 = uVar23;
                  uStack_11d6 = uVar24;
                  uStack_11d5 = uVar25;
                  uStack_11d4 = uVar26;
                  uStack_11d3 = uVar27;
                  uStack_11d2 = uVar28;
                  uStack_11d1 = uVar29;
                  uStack_11d0 = uVar30;
                  uStack_11cf = uVar31;
                  uStack_11ce = uVar32;
                  uStack_11cd = uVar33;
                  uStack_11cc = uVar34;
                  uStack_11cb = uVar35;
                  uStack_11ca = uVar36;
                  uStack_11c9 = uVar37;
                  do {
                    uVar5 = 0;
                    if (uVar11 != 0) {
                      for (; (uVar11 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
                      }
                    }
                    psVar6 = &(pSVar14->options).items.table_.
                              super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                              .arrays.groups_size_index + (ulong)uVar5 * 3;
                    bVar20 = __n_00 == *psVar6;
                    if (bVar20 && __n_00 != 0) {
                      iVar7 = bcmp(local_11e8,(void *)psVar6[1],__n_00);
                      bVar20 = iVar7 == 0;
                      pSVar14 = local_11f0;
                      uVar22 = local_11d8;
                      uVar23 = uStack_11d7;
                      uVar24 = uStack_11d6;
                      uVar25 = uStack_11d5;
                      uVar26 = uStack_11d4;
                      uVar27 = uStack_11d3;
                      uVar28 = uStack_11d2;
                      uVar29 = uStack_11d1;
                      uVar30 = uStack_11d0;
                      uVar31 = uStack_11cf;
                      uVar32 = uStack_11ce;
                      uVar33 = uStack_11cd;
                      uVar34 = uStack_11cc;
                      uVar35 = uStack_11cb;
                      uVar36 = uStack_11ca;
                      uVar37 = uStack_11c9;
                    }
                    if (bVar20) goto LAB_002959c6;
                    uVar11 = uVar11 - 1 & uVar11;
                    pgVar12 = local_1210;
                    pSVar13 = local_1228;
                    uVar15 = local_1230;
                    sVar17 = local_1220;
                    lVar18 = local_1238;
                    uVar10 = local_1218;
                  } while (uVar11 != 0);
                }
                pSVar14 = pSVar13;
                if ((pgVar12->m[lVar18 + 0xf].n &
                    (&boost::unordered::detail::foa::
                      group15<boost::unordered::detail::foa::plain_integral>::
                      is_not_overflowed(unsigned_long)::shift)[uVar10]) == 0) break;
                uVar16 = uVar15 + 1;
                pSVar13 = (ScriptSession *)
                          ((long)&(pSVar13->options).items.table_.
                                  super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                                  .arrays.groups_size_index + uVar15 + 1 & sVar17);
                pSVar14 = pSVar13;
              } while (uVar16 <= sVar17);
              local_1268 = (size_t *)0x0;
              psVar6 = local_1268;
LAB_002959c6:
              local_1268 = psVar6;
              if (local_1268 == (size_t *)0x0) {
                pSVar14 = (ScriptSession *)results;
                if ((results->table_).
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                    .size_ctrl.size <
                    (results->table_).
                    super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                    .size_ctrl.ml) {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
                  ::
                  nosize_unchecked_emplace_at<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ConstantValue*>
                            (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
                                   *)results,(arrays_type *)results,(size_t)local_1208,hash,
                             &local_1269,&name,&local_1240);
                  psVar6 = &(results->table_).
                            super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char>,_const_slang::ConstantValue_*>,_slang::hash<std::basic_string_view<char>_>,_std::equal_to<std::basic_string_view<char>_>,_std::allocator<std::pair<const_std::basic_string_view<char>,_const_slang::ConstantValue_*>_>_>
                            .size_ctrl.size;
                  *psVar6 = *psVar6 + 1;
                }
                else {
                  boost::unordered::detail::foa::
                  table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
                  ::
                  unchecked_emplace_with_rehash<boost::unordered::detail::foa::try_emplace_args_t,std::basic_string_view<char,std::char_traits<char>>&,slang::ConstantValue*>
                            (&res,(table_core<boost::unordered::detail::foa::flat_map_types<std::basic_string_view<char,std::char_traits<char>>,slang::ConstantValue_const*>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::basic_string_view<char,std::char_traits<char>>,void>,std::equal_to<std::basic_string_view<char,std::char_traits<char>>>,std::allocator<std::pair<std::basic_string_view<char,std::char_traits<char>>const,slang::ConstantValue_const*>>>
                                   *)results,hash,&local_1269,&name,&local_1240);
                }
              }
            }
            std::__detail::__variant::
            _Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
            ::~_Variant_storage((_Variant_storage<false,_std::monostate,_slang::SVInt,_slang::real_t,_slang::shortreal_t,_slang::ConstantValue::NullPlaceholder,_std::vector<slang::ConstantValue,_std::allocator<slang::ConstantValue>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_slang::CopyPtr<slang::AssociativeArray>,_slang::CopyPtr<slang::SVQueue>,_slang::CopyPtr<slang::SVUnion>,_slang::ConstantValue::UnboundedPlaceholder>
                                 *)&cv);
          }
          SmallVectorBase<slang::Diagnostic>::cleanup
                    ((SmallVectorBase<slang::Diagnostic> *)&localDiags,(EVP_PKEY_CTX *)pSVar14);
          if (bVar19) goto LAB_002957c9;
        }
        arg = (ScriptSession *)
              &(arg->options).items.table_.
               super_table_core_impl<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_slang::hash<std::type_index>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
               .size_ctrl;
      } while (arg != local_11e0);
    }
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&session.evalContext.warnings,
               (EVP_PKEY_CTX *)pSVar14);
    SmallVectorBase<slang::Diagnostic>::cleanup
              ((SmallVectorBase<slang::Diagnostic> *)&session.evalContext.diags,
               (EVP_PKEY_CTX *)pSVar14);
    if (session.evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.data_ !=
        (pointer)session.evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.
                 firstElement) {
      operator_delete(session.evalContext.lvalStack.super_SmallVectorBase<slang::ast::LValue_*>.
                      data_);
    }
    SmallVectorBase<slang::ast::EvalContext::Frame>::cleanup
              (&session.evalContext.stack.super_SmallVectorBase<slang::ast::EvalContext::Frame>,
               (EVP_PKEY_CTX *)pSVar14);
    std::
    vector<std::shared_ptr<slang::syntax::SyntaxTree>,_std::allocator<std::shared_ptr<slang::syntax::SyntaxTree>_>_>
    ::~vector(&session.syntaxTrees);
    ~Compilation(&session.compilation);
    boost::unordered::detail::foa::
    table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
    ::~table_core((table_core<boost::unordered::detail::foa::flat_map_types<std::type_index,_std::any>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::type_index,_void>,_std::equal_to<std::type_index>,_std::allocator<std::pair<const_std::type_index,_std::any>_>_>
                   *)&session);
  }
  return;
}

Assistant:

void Compilation::addGateType(const PrimitiveSymbol& prim) {
    SLANG_ASSERT(!isFrozen());
    SLANG_ASSERT(!prim.name.empty());
    gateMap.emplace(prim.name, &prim);
}